

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O3

bool __thiscall
ON_ComponentManifestImpl::RemoveItem
          (ON_ComponentManifestImpl *this,ON_ComponentManifestItem_PRIVATE *manifest_item)

{
  Type TVar1;
  ON__UINT64 sn;
  bool bVar2;
  ulong uVar3;
  
  if (manifest_item == (ON_ComponentManifestItem_PRIVATE *)0x0) {
    bVar2 = false;
  }
  else if (this->m_manifest_impl_sn == manifest_item->m_manifest_impl_sn) {
    this->m_manifest_content_version_number = this->m_manifest_content_version_number + 1;
    TVar1 = (manifest_item->super_ON_ComponentManifestItem).m_component_type;
    if (TVar1 < NumOf) {
      ON_ComponentManifestTableIndex::RemoveItem
                ((ON_ComponentManifestTableIndex *)
                 ((long)&this->m_table_index[0].m_manifest_table_sn + (ulong)((uint)TVar1 * 0x50)),
                 manifest_item);
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
                 ,0xebb,"","component_type is not valid");
    }
    sn = (manifest_item->super_ON_ComponentManifestItem).m_component_runtime_serial_number;
    if (sn != 0) {
      ON_SerialNumberMap::RemoveSerialNumberAndId(&this->m_component_serial_number_map,sn);
    }
    bVar2 = ON_UuidIsNotNil(&(manifest_item->super_ON_ComponentManifestItem).m_id);
    if (bVar2) {
      ON_ComponentIdHash32Table::RemoveManifestItem(&this->m_manifest_id_hash_table,manifest_item);
    }
    if (((manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_flags & 0xfffffff) != 0) {
      bVar2 = ::operator!=(&ON_SHA1_Hash::EmptyContentHash,
                           &(manifest_item->super_ON_ComponentManifestItem).m_name_hash.m_sha1_hash)
      ;
      if (bVar2) {
        TVar1 = (manifest_item->super_ON_ComponentManifestItem).m_component_type;
        bVar2 = ON_ModelComponent::UniqueNameRequired(TVar1);
        uVar3 = (ulong)!bVar2 << 5 | 0x6d0;
        if (TVar1 == Image) {
          uVar3 = 0x6d0;
        }
        ON_ComponentNameHash32Table::RemoveManifestItem
                  ((ON_ComponentNameHash32Table *)((long)this->m_table_index + (uVar3 - 8)),
                   manifest_item);
      }
    }
    DeallocateItem(this,manifest_item);
    bVar2 = true;
  }
  else {
    bVar2 = false;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
               ,0x107f,"","manifest_item is corrupt.");
  }
  return bVar2;
}

Assistant:

bool ON_ComponentManifestImpl::RemoveItem(
  const ON_ComponentManifestItem_PRIVATE* manifest_item
  )
{
  if ( nullptr == manifest_item )
    return false;
  
  if (this->m_manifest_impl_sn != manifest_item->m_manifest_impl_sn )
  {
    ON_ERROR("manifest_item is corrupt.");
    return false;
  }

  ON_ComponentManifestItem_PRIVATE* item = const_cast<ON_ComponentManifestItem_PRIVATE*>(manifest_item);
  m_manifest_content_version_number++;
  ON_ComponentManifestTableIndex* table_index = TableIndexFromType(item->m_component_type);
  if (nullptr != table_index)
    table_index->RemoveItem(item);
  if ( 0 != item->m_component_runtime_serial_number )
    m_component_serial_number_map.RemoveSerialNumberAndId(item->m_component_runtime_serial_number);
  if (ON_UuidIsNotNil(item->m_id))
    m_manifest_id_hash_table.RemoveManifestItem(item);
  if (item->m_name_hash.IsValidAndNotEmpty())
   ComponentNameHash32Table(item->m_component_type).RemoveManifestItem(item);
  DeallocateItem(item);
  return true;
}